

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O3

word_wrapper * __thiscall
pstore::command_line::word_wrapper::operator++
          (word_wrapper *__return_storage_ptr__,word_wrapper *this,int param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  
  __return_storage_ptr__->start_pos_ = this->start_pos_;
  uVar2 = *(undefined4 *)((long)&this->text_ + 4);
  sVar4 = this->max_width_;
  uVar3 = *(undefined4 *)((long)&this->max_width_ + 4);
  *(undefined4 *)&__return_storage_ptr__->text_ = *(undefined4 *)&this->text_;
  *(undefined4 *)((long)&__return_storage_ptr__->text_ + 4) = uVar2;
  *(int *)&__return_storage_ptr__->max_width_ = (int)sVar4;
  *(undefined4 *)((long)&__return_storage_ptr__->max_width_ + 4) = uVar3;
  (__return_storage_ptr__->substr_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->substr_).field_2;
  pcVar1 = (this->substr_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->substr_,pcVar1,
             pcVar1 + (this->substr_)._M_string_length);
  next(this);
  return __return_storage_ptr__;
}

Assistant:

word_wrapper word_wrapper::operator++ (int) {
                word_wrapper prev = *this;
                ++(*this);
                return prev;
            }